

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

ArrayElementRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
          (PoolAllocator *this,Context *args,Expression *args_1,
          pool_ptr<soul::AST::Expression> *args_2,pool_ptr<soul::AST::Expression> *args_3,
          bool *args_4)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::Expression> local_40;
  pool_ptr<soul::AST::Expression> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x50);
  local_38 = (pool_ptr<soul::AST::Expression>)args_2->object;
  local_40 = (pool_ptr<soul::AST::Expression>)args_3->object;
  AST::ArrayElementRef::ArrayElementRef
            ((ArrayElementRef *)&pPVar1->item,args,args_1,&local_38,&local_40,*args_4);
  pPVar1->destructor =
       allocate<soul::AST::ArrayElementRef,_const_soul::AST::Context_&,_soul::AST::Expression_&,_soul::pool_ptr<soul::AST::Expression>_&,_soul::pool_ptr<soul::AST::Expression>_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (ArrayElementRef *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }